

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

unsigned_long_long ZSTD_decompressBound(void *src,size_t srcSize)

{
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  unsigned_long_long decompressedBound;
  size_t compressedSize;
  ZSTD_frameSizeInfo frameSizeInfo;
  unsigned_long_long bound;
  size_t srcSize_local;
  void *src_local;
  
  frameSizeInfo.decompressedBound = 0;
  bound = srcSize;
  srcSize_local = (size_t)src;
  while( true ) {
    if (bound == 0) {
      return frameSizeInfo.decompressedBound;
    }
    ZSTD_findFrameSizeInfo((ZSTD_frameSizeInfo *)&compressedSize,(void *)srcSize_local,bound);
    sVar2 = frameSizeInfo.compressedSize;
    sVar1 = frameSizeInfo.nbBlocks;
    uVar3 = ERR_isError(frameSizeInfo.nbBlocks);
    if ((uVar3 != 0) || (sVar2 == 0xfffffffffffffffe)) break;
    if (bound < sVar1) {
      __assert_fail("srcSize >= compressedSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                    ,0x337,"unsigned long long ZSTD_decompressBound(const void *, size_t)");
    }
    srcSize_local = srcSize_local + sVar1;
    bound = bound - sVar1;
    frameSizeInfo.decompressedBound = sVar2 + frameSizeInfo.decompressedBound;
  }
  return 0xfffffffffffffffe;
}

Assistant:

unsigned long long ZSTD_decompressBound(const void* src, size_t srcSize)
{
    unsigned long long bound = 0;
    /* Iterate over each frame */
    while (srcSize > 0) {
        ZSTD_frameSizeInfo const frameSizeInfo = ZSTD_findFrameSizeInfo(src, srcSize);
        size_t const compressedSize = frameSizeInfo.compressedSize;
        unsigned long long const decompressedBound = frameSizeInfo.decompressedBound;
        if (ZSTD_isError(compressedSize) || decompressedBound == ZSTD_CONTENTSIZE_ERROR)
            return ZSTD_CONTENTSIZE_ERROR;
        assert(srcSize >= compressedSize);
        src = (const BYTE*)src + compressedSize;
        srcSize -= compressedSize;
        bound += decompressedBound;
    }
    return bound;
}